

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O3

void __thiscall OSSLEVPSymmetricAlgorithm::clean(OSSLEVPSymmetricAlgorithm *this)

{
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)this->pCurCTX);
  this->pCurCTX = (EVP_CIPHER_CTX *)0x0;
  BN_free((BIGNUM *)this->maximumBytes);
  this->maximumBytes = (BIGNUM *)0x0;
  BN_free((BIGNUM *)this->counterBytes);
  this->counterBytes = (BIGNUM *)0x0;
  return;
}

Assistant:

void OSSLEVPSymmetricAlgorithm::clean()
{
		EVP_CIPHER_CTX_free(pCurCTX);
		pCurCTX = NULL;
		BN_free(maximumBytes);
		maximumBytes = NULL;
		BN_free(counterBytes);
		counterBytes = NULL;
}